

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O2

void __thiscall FactoredMMDPDiscrete::Initialize2DBNObservations(FactoredMMDPDiscrete *this)

{
  uint uVar1;
  ulong uVar2;
  value_type pCVar3;
  reference ppCVar4;
  E *this_00;
  
  uVar2 = (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                 super_MultiAgentDecisionProcess + 0x10))();
  if (uVar2 != 0) {
    for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
      pCVar3 = (value_type)operator_new(8);
      pCVar3->_vptr_CPDDiscreteInterface = (_func_int **)&PTR__CPDDiscreteInterface_0061d080;
      ppCVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                          (&(this->super_FactoredDecPOMDPDiscrete).
                            super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn._m_O_CPDs,
                           (ulong)uVar1);
      *ppCVar4 = pCVar3;
    }
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"FactoredMMDPDiscrete::Initialize2DBNObservations() no agents specified");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBNObservations() {
    size_t nrAgents = GetNrAgents();
    if(nrAgents == 0)
        throw(E("FactoredMMDPDiscrete::Initialize2DBNObservations() no agents specified"));
    
    for(Index i=0; i<nrAgents; i++) {
        // attach identity function to 2BDN (fully-observable scenario)
        Get2DBN()->SetCPD_O(i, new CPDKroneckerDelta());
    }
}